

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateRAIIHandleCommandFactory
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams,bool definition,CommandFlavourFlags flavourFlags)

{
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *this_00;
  value_type vVar1;
  unsigned_long uVar2;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *initialSkipCount_00;
  size_t sVar4;
  CommandData *name_00;
  bool bVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  size_type sVar8;
  size_type sVar9;
  pointer ppVar10;
  vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_> *pvVar11;
  char *__s;
  MemberData *pMVar12;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c30;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_be0;
  byte local_b39;
  byte local_a69;
  bool local_a31;
  bool local_a0b;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_a09;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a08;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_980;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_940;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_900;
  undefined1 local_8c0 [71];
  allocator<char> local_879;
  undefined1 local_878 [8];
  string declarationTemplate;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_848;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_808;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_788;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_748;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_708;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_688;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_648;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_608;
  undefined1 local_5c8 [71];
  allocator<char> local_581;
  undefined1 local_580 [8];
  string definitionTemplate;
  string returnStatements;
  string resultCheck;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_518;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> local_4f8;
  undefined1 local_4c0 [8];
  string callSequence;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> local_498;
  undefined1 local_468 [8];
  string dataDeclarations;
  _Self local_440;
  const_iterator vectorParamIt;
  string vulkanType;
  undefined1 local_410 [8];
  string returnVariable;
  undefined1 local_3e8 [8];
  string dataType;
  undefined1 local_398 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dataTypes;
  string local_378;
  undefined1 local_358 [8];
  string className;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  undefined1 local_2f8 [8];
  string returnType;
  undefined1 local_2d0 [8];
  string noexceptString;
  string local_2a8;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  string local_1a8;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
  local_188;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
  local_180;
  undefined1 local_178 [8];
  string handleType;
  undefined1 local_150 [8];
  string commandName;
  string argumentList;
  undefined1 local_100 [8];
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> singularParams;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> skippedParams;
  undefined1 local_98 [6];
  bool singular;
  bool enumerating;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
  local_68;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
  local_60;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
  local_58;
  byte local_49;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvStack_48;
  bool definition_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams_local;
  size_t initialSkipCount_local;
  CommandData *commandData_local;
  string *name_local;
  VulkanHppGenerator *this_local;
  string *psStack_18;
  CommandFlavourFlags flavourFlags_local;
  
  this_local._7_1_ = (CommandFlavourFlags)flavourFlags.m_mask;
  local_49 = definition;
  pvStack_48 = returnParams;
  returnParams_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)initialSkipCount;
  initialSkipCount_local = (size_t)commandData;
  commandData_local = (CommandData *)name;
  name_local = &this->m_api;
  psStack_18 = __return_storage_ptr__;
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(returnParams);
  pvVar7 = std::
           vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>::
           operator[](&commandData->params,*pvVar6);
  bVar5 = isHandleType(this,&(pvVar7->type).type);
  local_a0b = true;
  if (!bVar5) {
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(pvStack_48);
    bVar5 = std::
            map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
            ::contains(vectorParams,pvVar6);
    local_a31 = false;
    if (bVar5) {
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(pvStack_48);
      local_58._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
           ::find(vectorParams,pvVar6);
      ppVar10 = std::
                _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                ::operator->(&local_58);
      local_a31 = false;
      if (((ppVar10->second).byStructure & 1U) != 0) {
        pvVar11 = (vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                   *)(initialSkipCount_local + 0x68);
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(pvStack_48);
        pvVar7 = std::
                 vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                 ::operator[](pvVar11,*pvVar6);
        pMVar12 = vectorMemberByStructure(this,&(pvVar7->type).type);
        local_a31 = isHandleType(this,&(pMVar12->type).type);
      }
    }
    local_a0b = local_a31;
  }
  if (local_a0b == false) {
    __assert_fail("isHandleType( commandData.params[returnParams.back()].type.type ) || ( vectorParams.contains( returnParams.back() ) && vectorParams.find( returnParams.back() )->second.byStructure && isHandleType( vectorMemberByStructure( commandData.params[returnParams.back()].type.type ).type.type ) )"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x243f,
                  "std::string VulkanHppGenerator::generateRAIIHandleCommandFactory(const std::string &, const CommandData &, size_t, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, bool, CommandFlavourFlags) const"
                 );
  }
  sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvStack_48);
  bVar5 = true;
  if (sVar8 != 1) {
    sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvStack_48);
    bVar5 = false;
    if (sVar8 == 2) {
      sVar9 = std::
              map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
              ::size(vectorParams);
      bVar5 = false;
      if (sVar9 == 1) {
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (pvStack_48,0);
        vVar1 = *pvVar6;
        local_60._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
             ::begin(vectorParams);
        ppVar10 = std::
                  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                  ::operator->(&local_60);
        bVar5 = false;
        if (vVar1 == (ppVar10->second).lenParam) {
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (pvStack_48,1);
          vVar1 = *pvVar6;
          local_68._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
               ::begin(vectorParams);
          ppVar10 = std::
                    _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                    ::operator->(&local_68);
          bVar5 = vVar1 == ppVar10->first;
        }
      }
    }
  }
  if (bVar5) {
    determineVoidPointerParams
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_98,this,
               (vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                *)(initialSkipCount_local + 0x68));
    bVar5 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::empty
                      ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)local_98);
    if (!bVar5) {
      __assert_fail("determineVoidPointerParams( commandData.params ).empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x2443,
                    "std::string VulkanHppGenerator::generateRAIIHandleCommandFactory(const std::string &, const CommandData &, size_t, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, bool, CommandFlavourFlags) const"
                   );
    }
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_98);
    skippedParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
         determineEnumeration(this,vectorParams,pvStack_48);
    skippedParams._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 4;
    skippedParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ =
         Flags<CommandFlavourFlagBits>::operator&
                   ((Flags<CommandFlavourFlagBits> *)((long)&this_local + 7),
                    (CommandFlavourFlagBits *)
                    ((long)&skippedParams._M_t._M_impl.super__Rb_tree_header._M_node_count + 5));
    determineSkippedParams
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &singularParams._M_t._M_impl.super__Rb_tree_header._M_node_count,this,
               (vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                *)(initialSkipCount_local + 0x68),(size_t)returnParams_local,vectorParams,pvStack_48
               ,(bool)skippedParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_);
    if ((skippedParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) == 0) {
      memset(local_100,0,0x30);
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 local_100);
    }
    else {
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(pvStack_48);
      determineSingularParams
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 local_100,this,*pvVar6,vectorParams);
    }
    generateRAIIHandleCommandFactoryArgumentList_abi_cxx11_
              ((string *)((long)&commandName.field_2 + 8),this,
               (vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                *)(initialSkipCount_local + 0x68),
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &singularParams._M_t._M_impl.super__Rb_tree_header._M_node_count,(bool)(local_49 & 1)
               ,(bool)(skippedParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1));
    handleType.field_2._M_local_buf[0xf] = this_local._7_1_;
    generateCommandName((string *)local_150,this,(string *)commandData_local,
                        (vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                         *)(initialSkipCount_local + 0x68),(size_t)returnParams_local,
                        this_local._7_1_);
    std::__cxx11::string::string((string *)local_178);
    sVar9 = std::
            map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
            ::size(vectorParams);
    local_a69 = 0;
    if (sVar9 == 1) {
      local_180._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
           ::begin(vectorParams);
      ppVar10 = std::
                _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                ::operator->(&local_180);
      local_a69 = (ppVar10->second).byStructure;
    }
    if ((local_a69 & 1) == 0) {
      pvVar11 = (vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                 *)(initialSkipCount_local + 0x68);
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(pvStack_48);
      pvVar7 = std::
               vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
               ::operator[](pvVar11,*pvVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE",&local_239);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"Vk",&local_261);
      TypeInfo::compose(&local_218,&pvVar7->type,&local_238,&local_260);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                 &local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_260);
      std::allocator<char>::~allocator(&local_261);
      std::__cxx11::string::~string((string *)&local_238);
      std::allocator<char>::~allocator(&local_239);
    }
    else {
      local_188._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
           ::begin(vectorParams);
      ppVar10 = std::
                _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                ::operator->(&local_188);
      uVar2 = ppVar10->first;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(pvStack_48);
      if (uVar2 != *pvVar6) {
        __assert_fail("vectorParams.begin()->first == returnParams.back()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x244f,
                      "std::string VulkanHppGenerator::generateRAIIHandleCommandFactory(const std::string &, const CommandData &, size_t, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, bool, CommandFlavourFlags) const"
                     );
      }
      pvVar7 = std::
               vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
               ::back((vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                       *)(initialSkipCount_local + 0x68));
      pMVar12 = vectorMemberByStructure(this,&(pvVar7->type).type);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE",&local_1c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"Vk",&local_1f1);
      TypeInfo::compose(&local_1a8,&pMVar12->type,&local_1c8,&local_1f0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                 &local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator(&local_1f1);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator(&local_1c9);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8," *",
               (allocator<char> *)(noexceptString.field_2._M_local_buf + 0xf));
    stripPostfix(&local_288,(string *)local_178,&local_2a8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
               &local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)(noexceptString.field_2._M_local_buf + 0xf))
    ;
    __s = "VULKAN_HPP_RAII_CREATE_NOEXCEPT";
    if ((skippedParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
      __s = "";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2d0,__s,(allocator<char> *)(returnType.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(returnType.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string
              ((string *)local_2f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(pvStack_48);
    bVar5 = std::
            map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
            ::contains(vectorParams,pvVar6);
    if ((bVar5) && ((skippedParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) == 0)
       ) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,"");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&className.field_2 + 8),"std::vector<",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178)
      ;
      std::operator+(&local_318,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&className.field_2 + 8),">");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
                 &local_318);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)(className.field_2._M_local_buf + 8));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,"s")
      ;
    }
    if ((local_49 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_878,
                 "\n  // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html\n  VULKAN_HPP_NODISCARD VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE::detail::CreateReturnType<${returnType}>::Type ${commandName}( ${argumentList} ) const ${noexcept};\n"
                 ,&local_879);
      std::allocator<char>::~allocator(&local_879);
      local_a08 = &local_a00;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (local_a08,(char (*) [13])"argumentList",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&commandName.field_2 + 8));
      local_a08 = &local_9c0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (local_a08,(char (*) [12])"commandName",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
      local_a08 = &local_980;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (local_a08,(char (*) [9])"noexcept",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
      local_a08 = &local_940;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (local_a08,(char (*) [11])"returnType",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
      local_a08 = &local_900;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[14],_true>
                (local_a08,(char (*) [14])"vkCommandName",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 commandData_local);
      local_8c0._0_8_ = &local_a00;
      local_8c0._8_8_ = 5;
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator(&local_a0a);
      __l._M_len = local_8c0._8_8_;
      __l._M_array = (iterator)local_8c0._0_8_;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_8c0 + 0x10),__l,&local_a09,&local_a0a);
      replaceWithMap(__return_storage_ptr__,(string *)local_878,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_8c0 + 0x10));
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_8c0 + 0x10));
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~allocator(&local_a0a);
      local_c30 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_8c0;
      do {
        local_c30 = local_c30 + -1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(local_c30);
      } while (local_c30 != &local_a00);
      declarationTemplate.field_2._8_4_ = 1;
      std::__cxx11::string::~string((string *)local_878);
    }
    else {
      dataTypes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      dataTypes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      dataTypes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
      if (returnParams_local == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
        std::allocator<char>::allocator();
        dataTypes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_358,"Context",
                   (allocator<char> *)
                   ((long)&dataTypes.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      }
      else {
        pvVar7 = std::
                 vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                 ::operator[]((vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                               *)(initialSkipCount_local + 0x68),
                              (size_type)
                              ((long)&returnParams_local[-1].
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::allocator<char>::allocator();
        dataTypes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_378,"Vk",
                   (allocator<char> *)
                   ((long)&dataTypes.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        dataTypes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
        stripPrefix((string *)local_358,&(pvVar7->type).type,&local_378);
      }
      if ((dataTypes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&dataTypes.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      }
      if ((dataTypes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_378);
      }
      if ((dataTypes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&dataTypes.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
      pvVar3 = pvStack_48;
      pvVar11 = (vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                 *)(initialSkipCount_local + 0x68);
      dataType.field_2._8_8_ = 0;
      this_00 = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                ((long)&dataType.field_2 + 8);
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                (this_00);
      determineDataTypes_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_398,this,pvVar11,vectorParams,pvVar3,this_00);
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 ((long)&dataType.field_2 + 8));
      returnVariable.field_2._M_local_buf[0xf] = this_local._7_1_;
      combineDataTypes((string *)local_3e8,this,vectorParams,pvStack_48,
                       (bool)(skippedParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ &
                             1),(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_398,this_local._7_1_,true);
      generateReturnVariable_abi_cxx11_
                ((string *)local_410,this,(CommandData *)initialSkipCount_local,pvStack_48,
                 vectorParams,this_local._7_1_);
      std::__cxx11::string::string((string *)&vectorParamIt);
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(pvStack_48);
      local_440._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
           ::find(vectorParams,pvVar6);
      dataDeclarations.field_2._8_8_ =
           std::
           map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
           ::end(vectorParams);
      bVar5 = std::operator==(&local_440,(_Self *)((long)&dataDeclarations.field_2 + 8));
      local_b39 = 0;
      if (((bVar5 ^ 0xffU) & 1) != 0) {
        ppVar10 = std::
                  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                  ::operator->(&local_440);
        local_b39 = (ppVar10->second).byStructure;
      }
      if ((local_b39 & 1) == 0) {
        pvVar11 = (vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                   *)(initialSkipCount_local + 0x68);
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(pvStack_48);
        pvVar7 = std::
                 vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                 ::operator[](pvVar11,*pvVar6);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &vectorParamIt,&(pvVar7->type).type);
      }
      else {
        pvVar11 = (vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                   *)(initialSkipCount_local + 0x68);
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(pvStack_48);
        pvVar7 = std::
                 vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                 ::operator[](pvVar11,*pvVar6);
        pMVar12 = vectorMemberByStructure(this,&(pvVar7->type).type);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &vectorParamIt,&(pMVar12->type).type);
      }
      sVar4 = initialSkipCount_local;
      pvVar3 = pvStack_48;
      local_498._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      local_498._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_498._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_498._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      local_498._M_t._M_impl._0_8_ = 0;
      local_498._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_498._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                (&local_498);
      callSequence.field_2._M_local_buf[0xf] = this_local._7_1_;
      generateDataDeclarations
                ((string *)local_468,this,(CommandData *)sVar4,pvVar3,vectorParams,&local_498,
                 this_local._7_1_,true,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_398,(string *)local_3e8,(string *)local_2f8,(string *)local_410);
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
                (&local_498);
      name_00 = commandData_local;
      sVar4 = initialSkipCount_local;
      initialSkipCount_00 = returnParams_local;
      pvVar3 = pvStack_48;
      local_4f8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      local_4f8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_4f8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_4f8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      local_4f8._M_t._M_impl._0_8_ = 0;
      local_4f8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_4f8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                (&local_4f8);
      local_518.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_518.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_518.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_518);
      generateCallSequence
                ((string *)local_4c0,this,(string *)name_00,(CommandData *)sVar4,pvVar3,vectorParams
                 ,(size_t)initialSkipCount_00,
                 (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 local_100,&local_4f8,&local_518,this_local._7_1_,true,true);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_518);
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
                (&local_4f8);
      generateResultCheckExpected
                ((string *)((long)&returnStatements.field_2 + 8),this,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(initialSkipCount_local + 0xd0),(string *)local_358,(string *)local_150);
      generateRAIIFactoryReturnStatements
                ((string *)((long)&definitionTemplate.field_2 + 8),this,
                 (vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                  *)(initialSkipCount_local + 0x68),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(initialSkipCount_local + 0xd0),(string *)&vectorParamIt,
                 (bool)(skippedParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1),
                 (string *)local_2f8,(string *)local_410,
                 (bool)(skippedParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_580,
                 "\n  // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html\n  VULKAN_HPP_NODISCARD VULKAN_HPP_INLINE VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE::detail::CreateReturnType<${returnType}>::Type ${className}::${commandName}( ${argumentList} ) const ${noexcept}\n  {\n    ${dataDeclarations}\n    ${callSequence}\n    ${resultCheck}\n    ${returnStatements}\n  }\n"
                 ,&local_581);
      std::allocator<char>::~allocator(&local_581);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_848,(char (*) [13])"argumentList",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&commandName.field_2 + 8));
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_808,(char (*) [13])"callSequence",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_7c8,(char (*) [10])"className",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_788,(char (*) [12])"commandName",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[17],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_748,(char (*) [17])"dataDeclarations",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_468);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_708,(char (*) [9])"noexcept",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_6c8,(char (*) [12])"resultCheck",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&returnStatements.field_2 + 8));
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[17],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_688,(char (*) [17])"returnStatements",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&definitionTemplate.field_2 + 8));
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_648,(char (*) [11])"returnType",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[14],_true>
                (&local_608,(char (*) [14])"vkCommandName",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 commandData_local);
      local_5c8._0_8_ = &local_848;
      local_5c8._8_8_ = 10;
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(declarationTemplate.field_2._M_local_buf + 0xe));
      __l_00._M_len = local_5c8._8_8_;
      __l_00._M_array = (iterator)local_5c8._0_8_;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_5c8 + 0x10),__l_00,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(declarationTemplate.field_2._M_local_buf + 0xf),
            (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(declarationTemplate.field_2._M_local_buf + 0xe));
      replaceWithMap(__return_storage_ptr__,(string *)local_580,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_5c8 + 0x10));
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_5c8 + 0x10));
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(declarationTemplate.field_2._M_local_buf + 0xe));
      local_be0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_5c8;
      do {
        local_be0 = local_be0 + -1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(local_be0);
      } while (local_be0 != &local_848);
      declarationTemplate.field_2._8_4_ = 1;
      std::__cxx11::string::~string((string *)local_580);
      std::__cxx11::string::~string((string *)(definitionTemplate.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(returnStatements.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_4c0);
      std::__cxx11::string::~string((string *)local_468);
      std::__cxx11::string::~string((string *)&vectorParamIt);
      std::__cxx11::string::~string((string *)local_410);
      std::__cxx11::string::~string((string *)local_3e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_398);
      std::__cxx11::string::~string((string *)local_358);
    }
    std::__cxx11::string::~string((string *)local_2f8);
    std::__cxx11::string::~string((string *)local_2d0);
    std::__cxx11::string::~string((string *)local_178);
    std::__cxx11::string::~string((string *)local_150);
    std::__cxx11::string::~string((string *)(commandName.field_2._M_local_buf + 8));
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_100);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &singularParams._M_t._M_impl.super__Rb_tree_header._M_node_count);
    return __return_storage_ptr__;
  }
  __assert_fail("( returnParams.size() == 1 ) || ( ( returnParams.size() == 2 ) && ( vectorParams.size() == 1 ) && ( returnParams[0] == vectorParams.begin()->second.lenParam ) && ( returnParams[1] == vectorParams.begin()->first ) )"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                ,0x2442,
                "std::string VulkanHppGenerator::generateRAIIHandleCommandFactory(const std::string &, const CommandData &, size_t, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, bool, CommandFlavourFlags) const"
               );
}

Assistant:

std::string VulkanHppGenerator::generateRAIIHandleCommandFactory( std::string const &                       name,
                                                                  CommandData const &                       commandData,
                                                                  size_t                                    initialSkipCount,
                                                                  std::vector<size_t> const &               returnParams,
                                                                  std::map<size_t, VectorParamData> const & vectorParams,
                                                                  bool                                      definition,
                                                                  CommandFlavourFlags                       flavourFlags ) const
{
  assert( isHandleType( commandData.params[returnParams.back()].type.type ) ||
          ( vectorParams.contains( returnParams.back() ) && vectorParams.find( returnParams.back() )->second.byStructure &&
            isHandleType( vectorMemberByStructure( commandData.params[returnParams.back()].type.type ).type.type ) ) );
  assert( ( returnParams.size() == 1 ) ||
          ( ( returnParams.size() == 2 ) && ( vectorParams.size() == 1 ) && ( returnParams[0] == vectorParams.begin()->second.lenParam ) &&
            ( returnParams[1] == vectorParams.begin()->first ) ) );
  assert( determineVoidPointerParams( commandData.params ).empty() );

  const bool       enumerating    = determineEnumeration( vectorParams, returnParams );
  const bool       singular       = flavourFlags & CommandFlavourFlagBits::singular;
  std::set<size_t> skippedParams  = determineSkippedParams( commandData.params, initialSkipCount, vectorParams, returnParams, singular );
  std::set<size_t> singularParams = singular ? determineSingularParams( returnParams.back(), vectorParams ) : std::set<size_t>();
  std::string      argumentList   = generateRAIIHandleCommandFactoryArgumentList( commandData.params, skippedParams, definition, singular );
  std::string      commandName    = generateCommandName( name, commandData.params, initialSkipCount, flavourFlags );

  std::string handleType;
  if ( ( vectorParams.size() == 1 ) && vectorParams.begin()->second.byStructure )
  {
    assert( vectorParams.begin()->first == returnParams.back() );
    handleType = vectorMemberByStructure( commandData.params.back().type.type ).type.compose( "VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE" );
  }
  else
  {
    handleType = commandData.params[returnParams.back()].type.compose( "VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE" );
  }
  handleType                 = stripPostfix( handleType, " *" );
  std::string noexceptString = enumerating ? "" : "VULKAN_HPP_RAII_CREATE_NOEXCEPT";
  std::string returnType     = handleType;
  if ( vectorParams.contains( returnParams.back() ) && !singular )
  {
    noexceptString = "";
    returnType     = "std::vector<" + handleType + ">";
    handleType += "s";
  }

  if ( definition )
  {
    std::string              className      = initialSkipCount ? stripPrefix( commandData.params[initialSkipCount - 1].type.type, "Vk" ) : "Context";
    std::vector<std::string> dataTypes      = determineDataTypes( commandData.params, vectorParams, returnParams, {} );
    std::string              dataType       = combineDataTypes( vectorParams, returnParams, enumerating, dataTypes, flavourFlags, true );
    std::string              returnVariable = generateReturnVariable( commandData, returnParams, vectorParams, flavourFlags );
    std::string              vulkanType;
    auto                     vectorParamIt = vectorParams.find( returnParams.back() );
    if ( ( vectorParamIt != vectorParams.end() ) && vectorParamIt->second.byStructure )
    {
      vulkanType = vectorMemberByStructure( commandData.params[returnParams.back()].type.type ).type.type;
    }
    else
    {
      vulkanType = commandData.params[returnParams.back()].type.type;
    }

    std::string dataDeclarations =
      generateDataDeclarations( commandData, returnParams, vectorParams, {}, flavourFlags, true, dataTypes, dataType, returnType, returnVariable );
    std::string callSequence =
      generateCallSequence( name, commandData, returnParams, vectorParams, initialSkipCount, singularParams, {}, {}, flavourFlags, true, true );
    std::string resultCheck = generateResultCheckExpected( commandData.successCodes, className, commandName );
    std::string returnStatements =
      generateRAIIFactoryReturnStatements( commandData.params, commandData.successCodes, vulkanType, enumerating, returnType, returnVariable, singular );

    std::string const definitionTemplate =
      R"(
  // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html
  VULKAN_HPP_NODISCARD VULKAN_HPP_INLINE VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE::detail::CreateReturnType<${returnType}>::Type ${className}::${commandName}( ${argumentList} ) const ${noexcept}
  {
    ${dataDeclarations}
    ${callSequence}
    ${resultCheck}
    ${returnStatements}
  }
)";

    return replaceWithMap( definitionTemplate,
                           { { "argumentList", argumentList },
                             { "callSequence", callSequence },
                             { "className", className },
                             { "commandName", commandName },
                             { "dataDeclarations", dataDeclarations },
                             { "noexcept", noexceptString },
                             { "resultCheck", resultCheck },
                             { "returnStatements", returnStatements },
                             { "returnType", returnType },
                             { "vkCommandName", name } } );
  }
  else
  {
    std::string const declarationTemplate =
      R"(
  // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html
  VULKAN_HPP_NODISCARD VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE::detail::CreateReturnType<${returnType}>::Type ${commandName}( ${argumentList} ) const ${noexcept};
)";

    return replaceWithMap( declarationTemplate,
                           { { "argumentList", argumentList },
                             { "commandName", commandName },
                             { "noexcept", noexceptString },
                             { "returnType", returnType },
                             { "vkCommandName", name } } );
  }
}